

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O0

void sse::common::zero<long>(long *pDst,int len)

{
  int len_local;
  long *pDst_local;
  int local_26c;
  long *local_268;
  
  local_268 = pDst;
  for (local_26c = len >> 1; 3 < local_26c; local_26c = local_26c + -4) {
    *local_268 = 0;
    local_268[1] = 0;
    local_268[2] = 0;
    local_268[3] = 0;
    local_268[4] = 0;
    local_268[5] = 0;
    local_268[6] = 0;
    local_268[7] = 0;
    local_268 = local_268 + 8;
  }
  if (1 < local_26c) {
    *local_268 = 0;
    local_268[1] = 0;
    local_268[2] = 0;
    local_268[3] = 0;
    local_26c = local_26c + -2;
    local_268 = local_268 + 4;
  }
  if (local_26c != 0) {
    *local_268 = 0;
    local_268[1] = 0;
  }
  if (len != 0) {
    pDst[len + -1] = 0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }